

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndTabItem(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *this;
  short sVar2;
  ImGuiTabItem *pIVar3;
  
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    this = GImGui->CurrentTabBar;
    if (this == (ImGuiTabBar *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc2,"EndTabItem","ImGui ASSERT FAILED: %s",
                  "tab_bar != NULL && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                 );
      return;
    }
    sVar2 = this->LastTabItemIdx;
    if (sVar2 < 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc5,"EndTabItem","ImGui ASSERT FAILED: %s","tab_bar->LastTabItemIdx >= 0");
      sVar2 = this->LastTabItemIdx;
    }
    pIVar3 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,(int)sVar2);
    if ((pIVar3->Flags & 8) == 0) {
      ImVector<unsigned_int>::pop_back(&pIVar1->IDStack);
      return;
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar != NULL && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        window->IDStack.pop_back();
}